

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::consume_temporary_in_precision_context
          (CompilerGLSL *this,uint32_t type_id,uint32_t id,Precision precision)

{
  ParsedIR *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  Types TVar1;
  bool bVar2;
  ID id_00;
  SPIRType *pSVar3;
  iterator iVar4;
  mapped_type *this_02;
  Meta *pMVar5;
  mapped_type *pmVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  __ireturn_type _Var7;
  ID local_88;
  uint32_t alias_id;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  string local_78;
  string alias_name;
  char *local_38;
  
  TVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type;
  if ((((TypeUndef < TVar1) || ((0x1208U >> (TVar1 & 0x1f) & 1) == 0)) &&
      (local_88.id = id,
      pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id),
      pSVar3->pointer == false)) &&
     ((pSVar3->basetype < Double && ((0x2180U >> (pSVar3->basetype & (Image|Struct)) & 1) != 0)))) {
    if (precision == DontCare) {
      _Var7 = ::std::__detail::
              _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&(this->super_Compiler).forced_temporaries,&local_88.id);
      id = local_88.id;
      if (((undefined1  [16])_Var7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
        id = local_88.id;
      }
    }
    else {
      bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationRelaxedPrecision);
      if ((bVar2 ^ Highp) != precision) {
        iVar4 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->temporary_to_mirror_precision_alias)._M_h,&local_88.id);
        if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          this_00 = &(this->super_Compiler).ir;
          local_80 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->temporary_to_mirror_precision_alias;
          id_00.id = ParsedIR::increase_bound_by(this_00,1);
          alias_id = id_00.id;
          alias_name._M_dataplus._M_p._0_4_ = id_00.id;
          this_02 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->super_Compiler).ir.meta,(key_type *)&alias_name);
          pMVar5 = ParsedIR::find_meta(this_00,local_88);
          if (pMVar5 != (Meta *)0x0) {
            Meta::operator=(this_02,pMVar5);
          }
          if (precision == Mediump) {
            Compiler::set_decoration(&this->super_Compiler,id_00,DecorationRelaxedPrecision,0);
            local_38 = "mp_copy_";
          }
          else {
            Compiler::unset_decoration(&this->super_Compiler,id_00,DecorationRelaxedPrecision);
            local_38 = "hp_copy_";
          }
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
          (*(this->super_Compiler)._vptr_Compiler[6])(&local_78,this,(ulong)local_88.id);
          join<char_const*&,std::__cxx11::string>
                    (&alias_name,(spirv_cross *)&local_38,(char **)&local_78,ts_1);
          ::std::__cxx11::string::~string((string *)&local_78);
          ParsedIR::sanitize_underscores(&alias_name);
          Compiler::set_name(&this->super_Compiler,id_00,&alias_name);
          to_expression_abi_cxx11_(&local_78,this,local_88.id,true);
          emit_op(this,type_id,id_00.id,&local_78,true,false);
          ::std::__cxx11::string::~string((string *)&local_78);
          pmVar6 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_80,&local_88.id);
          *pmVar6 = id_00.id;
          this_01 = &(this->super_Compiler).forced_temporaries;
          ::std::__detail::
          _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)this_01,&local_88.id);
          ::std::__detail::
          _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)this_01,&alias_id);
          Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
          local_88.id = alias_id;
          ::std::__cxx11::string::~string((string *)&alias_name);
          id = local_88.id;
        }
        else {
          id = *(uint32_t *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                       ._M_cur + 0xc);
        }
      }
    }
  }
  return id;
}

Assistant:

uint32_t CompilerGLSL::consume_temporary_in_precision_context(uint32_t type_id, uint32_t id, Options::Precision precision)
{
	// Constants do not have innate precision.
	auto handle_type = ir.ids[id].get_type();
	if (handle_type == TypeConstant || handle_type == TypeConstantOp || handle_type == TypeUndef)
		return id;

	// Ignore anything that isn't 32-bit values.
	auto &type = get<SPIRType>(type_id);
	if (type.pointer)
		return id;
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::UInt && type.basetype != SPIRType::Int)
		return id;

	if (precision == Options::DontCare)
	{
		// If precision is consumed as don't care (operations only consisting of constants),
		// we need to bind the expression to a temporary,
		// otherwise we have no way of controlling the precision later.
		auto itr = forced_temporaries.insert(id);
		if (itr.second)
			force_recompile_guarantee_forward_progress();
		return id;
	}

	auto current_precision = has_decoration(id, DecorationRelaxedPrecision) ? Options::Mediump : Options::Highp;
	if (current_precision == precision)
		return id;

	auto itr = temporary_to_mirror_precision_alias.find(id);
	if (itr == temporary_to_mirror_precision_alias.end())
	{
		uint32_t alias_id = ir.increase_bound_by(1);
		auto &m = ir.meta[alias_id];
		if (auto *input_m = ir.find_meta(id))
			m = *input_m;

		const char *prefix;
		if (precision == Options::Mediump)
		{
			set_decoration(alias_id, DecorationRelaxedPrecision);
			prefix = "mp_copy_";
		}
		else
		{
			unset_decoration(alias_id, DecorationRelaxedPrecision);
			prefix = "hp_copy_";
		}

		auto alias_name = join(prefix, to_name(id));
		ParsedIR::sanitize_underscores(alias_name);
		set_name(alias_id, alias_name);

		emit_op(type_id, alias_id, to_expression(id), true);
		temporary_to_mirror_precision_alias[id] = alias_id;
		forced_temporaries.insert(id);
		forced_temporaries.insert(alias_id);
		force_recompile_guarantee_forward_progress();
		id = alias_id;
	}
	else
	{
		id = itr->second;
	}

	return id;
}